

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_256_paramSetA.c
# Opt level: O2

void scalar_wnaf(int8_t *out,uchar *in)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  byte bVar4;
  long lVar5;
  
  uVar1 = (uint)(*in & 0x3f);
  for (lVar5 = -0x201; lVar5 != 0; lVar5 = lVar5 + 1) {
    bVar4 = (byte)uVar1;
    uVar1 = (int)(char)bVar4 & 1;
    cVar3 = (((bVar4 & 0x3f) < 0x20) << 6 | bVar4 & 0x3f) - 0x40;
    if (uVar1 == 0) {
      cVar3 = (char)uVar1;
    }
    out[lVar5 + 0x201] = cVar3;
    iVar2 = scalar_get_bit(in,(int)lVar5 + 0x207);
    uVar1 = ((uint)((int)(char)bVar4 - (int)cVar3) >> 1) + iVar2 * 0x20;
  }
  return;
}

Assistant:

static void scalar_wnaf(int8_t out[257], const unsigned char in[32]) {
    int i;
    int8_t window, d;

    window = in[0] & (DRADIX_WNAF - 1);
    for (i = 0; i < 257; i++) {
        d = 0;
        if ((window & 1) && ((d = window & (DRADIX_WNAF - 1)) & DRADIX))
            d -= DRADIX_WNAF;
        out[i] = d;
        window = (window - d) >> 1;
        window += scalar_get_bit(in, i + 1 + RADIX) << RADIX;
    }
}